

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::APFloat::convertToInteger
          (APFloat *this,APSInt *result,roundingMode rounding_mode,bool *isExact)

{
  uint Width;
  opStatus oVar1;
  MutableArrayRef<unsigned_long> Input;
  ArrayRef<unsigned_long> bigVal;
  SmallVector<unsigned_long,_4U> parts;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  unsigned_long local_68;
  SmallVectorImpl<unsigned_long> local_60;
  undefined1 local_50 [32];
  
  Width = *(uint *)(result + 8);
  local_68 = 0;
  local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX = local_50;
  local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity = 4;
  SmallVectorImpl<unsigned_long>::assign(&local_60,(ulong)Width + 0x3f >> 6,&local_68);
  Input.super_ArrayRef<unsigned_long>.Length._0_4_ =
       local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
       super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size;
  Input.super_ArrayRef<unsigned_long>.Data =
       (unsigned_long *)
       local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
       super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
  Input.super_ArrayRef<unsigned_long>.Length._4_4_ = 0;
  oVar1 = convertToInteger(this,Input,Width,(bool)((byte)result[0xc] ^ 1),rounding_mode,isExact);
  bigVal.Length._0_4_ =
       local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
       super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size;
  bigVal.Data = (unsigned_long *)
                local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
                super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
  bigVal.Length._4_4_ = 0;
  APInt::APInt((APInt *)&local_78,Width,bigVal);
  APInt::operator=((APInt *)result,(APInt *)&local_78);
  if ((0x40 < local_70) && ((void *)local_78.VAL != (void *)0x0)) {
    operator_delete__(local_78.pVal);
  }
  if ((undefined1 *)
      local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX != local_50)
  {
    free(local_60.super_SmallVectorTemplateBase<unsigned_long,_true>.
         super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX);
  }
  return oVar1;
}

Assistant:

APFloat::opStatus APFloat::convertToInteger(APSInt &result,
                                            roundingMode rounding_mode,
                                            bool *isExact) const {
  unsigned bitWidth = result.getBitWidth();
  SmallVector<uint64_t, 4> parts(result.getNumWords());
  opStatus status = convertToInteger(parts, bitWidth, result.isSigned(),
                                     rounding_mode, isExact);
  // Keeps the original signed-ness.
  result = APInt(bitWidth, parts);
  return status;
}